

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

vec4 __thiscall vera::Triangle::getColor(Triangle *this,vec3 *_barycenter)

{
  Material *pMVar1;
  bool bVar2;
  vec4 *pvVar3;
  vec4 vVar4;
  vec<4,_float,_(glm::qualifier)0> vVar5;
  vec<4,_float,_(glm::qualifier)0> local_fc;
  vec<4,_float,_(glm::qualifier)0> local_ec;
  vec<4,_float,_(glm::qualifier)0> local_dc;
  vec<4,_float,_(glm::qualifier)0> local_cc;
  allocator local_b9;
  string local_b8;
  vec2 local_94;
  vec<2,_float,_(glm::qualifier)0> local_8c;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  vec3 *local_28;
  vec3 *_barycenter_local;
  Triangle *this_local;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_10;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_c;
  
  local_28 = _barycenter;
  _barycenter_local = (vec3 *)this;
  if (this->material != (Material *)0x0) {
    pMVar1 = this->material;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"diffuse",&local_49);
    bVar2 = Material::haveProperty(pMVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (bVar2) {
      bVar2 = haveTexCoords(this);
      if (bVar2) {
        pMVar1 = this->material;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_80,"diffuse",&local_81);
        local_94 = getTexCoord(this,local_28);
        local_8c = glm::fract<2,float,(glm::qualifier)0>(&local_94);
        vVar4 = Material::getColor(pMVar1,&local_80,&local_8c);
        _local_10 = vVar4._8_8_;
        this_local = vVar4._0_8_;
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      else {
        pMVar1 = this->material;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,"diffuse",&local_b9);
        vVar4 = Material::getColor(pMVar1,&local_b8);
        _local_10 = vVar4._8_8_;
        this_local = vVar4._0_8_;
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      goto LAB_004b4ccf;
    }
  }
  bVar2 = haveColors(this);
  if (bVar2) {
    pvVar3 = getColor(this,0);
    vVar5 = glm::operator*(pvVar3,(local_28->field_0).x);
    local_dc._0_8_ = vVar5._0_8_;
    local_dc._8_8_ = vVar5._8_8_;
    pvVar3 = getColor(this,1);
    vVar5 = glm::operator*(pvVar3,(local_28->field_1).y);
    local_ec._0_8_ = vVar5._0_8_;
    local_ec._8_8_ = vVar5._8_8_;
    vVar5 = glm::operator+(&local_dc,&local_ec);
    local_cc._0_8_ = vVar5._0_8_;
    local_cc._8_8_ = vVar5._8_8_;
    pvVar3 = getColor(this,2);
    vVar5 = glm::operator*(pvVar3,(local_28->field_2).z);
    local_fc._0_8_ = vVar5._0_8_;
    local_fc._8_8_ = vVar5._8_8_;
    vVar5 = glm::operator+(&local_cc,&local_fc);
    this_local = vVar5._0_8_;
    _local_10 = vVar5._8_8_;
  }
  else {
    glm::vec<4,_float,_(glm::qualifier)0>::vec((vec<4,_float,_(glm::qualifier)0> *)&this_local,1.0);
  }
LAB_004b4ccf:
  vVar4.field_2 = local_10;
  vVar4.field_3 = aStack_c;
  vVar4._0_8_ = this_local;
  return vVar4;
}

Assistant:

glm::vec4 Triangle::getColor(const glm::vec3& _barycenter) const {
    if (material != nullptr) {
        if ( material->haveProperty("diffuse") ) {
            if (haveTexCoords())
                return material->getColor("diffuse", glm::fract( getTexCoord(_barycenter) ) );
            else
                return material->getColor("diffuse");
        }
    }

    if (haveColors())
        return  getColor(0) * _barycenter.x +
                getColor(1) * _barycenter.y +
                getColor(2) * _barycenter.z;
    else
        return glm::vec4(1.0f);
}